

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

CharPtr __thiscall fmt::BasicWriter<wchar_t>::grow_buffer(BasicWriter<wchar_t> *this,size_t n)

{
  long lVar1;
  
  lVar1 = *(long *)(*(Buffer<wchar_t> **)(this + 8) + 0x10);
  Buffer<wchar_t>::resize(*(Buffer<wchar_t> **)(this + 8),n + lVar1);
  return (CharPtr)(lVar1 * 4 + *(long *)(*(long *)(this + 8) + 8));
}

Assistant:

CharPtr grow_buffer(std::size_t n) {
    std::size_t size = buffer_.size();
    buffer_.resize(size + n);
    return internal::make_ptr(&buffer_[size], n);
  }